

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_type sVar7;
  char in_CL;
  char in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte bVar8;
  size_type divloc2;
  size_type divloc;
  bool skip;
  size_type nspace;
  size_type kloc;
  size_type offset;
  size_type modfind;
  bool modified;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  char in_stack_ffffffffffffff9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_type __pos;
  size_type in_stack_ffffffffffffffb0;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  bool local_13;
  
  local_13 = false;
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __c = (char)(in_stack_ffffffffffffffb0 >> 0x38);
  if (sVar3 != 0xffffffffffffffff) {
    __pos = sVar3;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_RSI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
              (in_stack_ffffffffffffffa0);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_not_of(in_stack_ffffffffffffffb8,__c,__pos);
    if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   0xffffffffffffffff) &&
       ((pvVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                            (in_stack_ffffffffffffffa0,
                             CONCAT17(in_stack_ffffffffffffff9f,
                                      CONCAT16(in_stack_ffffffffffffff9e,
                                               CONCAT15(in_stack_ffffffffffffff9d,
                                                        CONCAT14(in_stack_ffffffffffffff9c,
                                                                 in_stack_ffffffffffffff98))))),
        *pvVar5 == in_DL ||
        (pvVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                            (in_stack_ffffffffffffffa0,
                             CONCAT17(in_stack_ffffffffffffff9f,
                                      CONCAT16(in_stack_ffffffffffffff9e,
                                               CONCAT15(in_stack_ffffffffffffff9d,
                                                        CONCAT14(in_stack_ffffffffffffff9c,
                                                                 in_stack_ffffffffffffff98))))),
        *pvVar5 == in_CL)))) {
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffa0,
                            CONCAT17(in_stack_ffffffffffffff9f,
                                     CONCAT16(in_stack_ffffffffffffff9e,
                                              CONCAT15(in_stack_ffffffffffffff9d,
                                                       CONCAT14(in_stack_ffffffffffffff9c,
                                                                in_stack_ffffffffffffff98)))));
      *pvVar5 = '_';
      local_13 = true;
    }
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,0x6cf0ad);
    pbVar9 = this;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(in_RDI);
    bVar8 = pbVar6 <= this;
    if (pbVar6 > this) {
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,CONCAT17(in_stack_ffffffffffffff9f,
                                          CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT15(in_stack_ffffffffffffff9d,
                                                            CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98)))));
      bVar1 = isOperator(*pvVar5);
      in_stack_ffffffffffffff9f = true;
      bVar8 = in_stack_ffffffffffffff9f;
      if (!bVar1) {
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (this,CONCAT17(1,CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT15(in_stack_ffffffffffffff9d,
                                                              CONCAT14(in_stack_ffffffffffffff9c,
                                                                       in_stack_ffffffffffffff98))))
                           );
        in_stack_ffffffffffffff9f = isOperator(*pvVar5);
        bVar8 = in_stack_ffffffffffffff9f;
      }
    }
    if ((bool)bVar8 == false) {
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,CONCAT17(in_stack_ffffffffffffff9f,
                                          CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT15(in_stack_ffffffffffffff9d,
                                                            CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98)))));
      in_stack_ffffffffffffff9e = true;
      if (*pvVar5 != '(') {
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (this,CONCAT17(in_stack_ffffffffffffff9f,
                                          CONCAT16(1,CONCAT15(in_stack_ffffffffffffff9d,
                                                              CONCAT14(in_stack_ffffffffffffff9c,
                                                                       in_stack_ffffffffffffff98))))
                           );
        in_stack_ffffffffffffff9e = *pvVar5 == '(';
      }
      in_stack_ffffffffffffff9d = true;
      bVar8 = in_stack_ffffffffffffff9e;
      if ((bool)in_stack_ffffffffffffff9e == false) {
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (this,CONCAT17(in_stack_ffffffffffffff9f,
                                          (uint7)CONCAT15(1,CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98))));
        in_stack_ffffffffffffff9d = true;
        if (*pvVar5 != '-') {
          pvVar5 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (this,CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT15(1,CONCAT14(in_stack_ffffffffffffff9c,
                                                                         in_stack_ffffffffffffff98))
                                                    )));
          in_stack_ffffffffffffff9d = *pvVar5 == '-';
        }
      }
      bVar1 = (bVar8 & 1) != 0;
      bVar8 = bVar1 || (bool)in_stack_ffffffffffffff9d != false;
      in_stack_ffffffffffffff9c = true;
      if (!bVar1 && (bool)in_stack_ffffffffffffff9d == false) {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(pbVar4,(size_type)pbVar9,CONCAT17(bVar8,in_stack_ffffffffffffffc0),
                          (char *)in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffff9c = iVar2 == 0;
      }
      bVar1 = (bVar8 & 1) != 0;
      bVar8 = bVar1 || (bool)in_stack_ffffffffffffff9c != false;
      in_stack_ffffffffffffff98 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
      if (!bVar1 && (bool)in_stack_ffffffffffffff9c == false) {
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (this,CONCAT17(in_stack_ffffffffffffff9f,
                                          CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT15(in_stack_ffffffffffffff9d,
                                                            CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98)))));
        in_stack_ffffffffffffff98 = CONCAT13(*pvVar5 == 'U',(int3)in_stack_ffffffffffffff98);
      }
      bVar8 = (bVar8 & 1) != 0 || (char)((uint)in_stack_ffffffffffffff98 >> 0x18) != '\0';
    }
    if ((bool)bVar8 == false) {
      sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of(this,in_stack_ffffffffffffff9f,0x6cf2b8);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of(this,in_stack_ffffffffffffff9f,0x6cf2d5);
      if (sVar7 < sVar3) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (pbVar4,__pos,(size_type)this,in_stack_ffffffffffffff9f);
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar9->_M_dataplus)._M_p + 1);
        if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0xffffffffffffffff) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xffffffffffffffff,(char)(__pos >> 0x38));
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(pbVar4,__pos,(size_type)this,in_stack_ffffffffffffff9f);
        }
        bVar8 = (bVar8 & 1) != 0 || pbVar4 < pbVar9;
        local_13 = true;
      }
      else if (pbVar4 < pbVar9) {
        bVar8 = 1;
      }
    }
    if ((bVar8 & 1) == 0) {
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,CONCAT17(in_stack_ffffffffffffff9f,
                                          CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT15(in_stack_ffffffffffffff9d,
                                                            CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98)))));
      *pvVar5 = '*';
      local_13 = true;
    }
  }
  return local_13;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}